

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx.h
# Opt level: O3

int glad_glx_has_extension(Display *display,int screen,char *ext)

{
  byte *__haystack;
  byte *__haystack_00;
  byte *pbVar1;
  size_t sVar2;
  
  if (((sf_glad_glXQueryExtensionsString != (PFNGLXQUERYEXTENSIONSSTRINGPROC)0x0) &&
      (__haystack_00 = (byte *)(*sf_glad_glXQueryExtensionsString)(display,screen),
      ext != (char *)0x0 && __haystack_00 != (byte *)0x0)) &&
     (pbVar1 = (byte *)strstr((char *)__haystack_00,ext), pbVar1 != (byte *)0x0)) {
    sVar2 = strlen(ext);
    do {
      __haystack = pbVar1 + sVar2;
      if (((pbVar1 == __haystack_00) || (pbVar1[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) {
        return 1;
      }
      pbVar1 = (byte *)strstr((char *)__haystack,ext);
      __haystack_00 = __haystack;
    } while (pbVar1 != (byte *)0x0);
  }
  return 0;
}

Assistant:

static int glad_glx_has_extension(Display *display, int screen, const char *ext) {
#ifndef GLX_VERSION_1_1
    (void) display;
    (void) screen;
    (void) ext;
#else
    const char *terminator;
    const char *loc;
    const char *extensions;

    if (glXQueryExtensionsString == NULL) {
        return 0;
    }

    extensions = glXQueryExtensionsString(display, screen);

    if(extensions == NULL || ext == NULL) {
        return 0;
    }

    while(1) {
        loc = strstr(extensions, ext);
        if(loc == NULL)
            break;

        terminator = loc + strlen(ext);
        if((loc == extensions || *(loc - 1) == ' ') &&
            (*terminator == ' ' || *terminator == '\0')) {
            return 1;
        }
        extensions = terminator;
    }
#endif

    return 0;
}